

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdChroma::~MthdChroma(MthdChroma *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00348698;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			exp.chroma = pgraph_to_a1r10g10b10(pgraph_expand_color(&exp, val));
		} else {
			if (cls == 0x17)
				nv04_pgraph_set_chroma_nv01(&exp, val);
			else
				exp.chroma = val;
		}
	}